

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testIsInfinite<Imath_2_5::Vec3<double>>(char *type)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  double *pdVar6;
  char *in_RDI;
  Box<Imath_2_5::Vec3<double>_> b_1;
  Vec3<double> max;
  Vec3<double> min;
  Box<Imath_2_5::Vec3<double>_> b1;
  uint i;
  Vec3<double> p1;
  Vec3<double> p0;
  Box<Imath_2_5::Vec3<double>_> b0;
  Box<Imath_2_5::Vec3<double>_> b;
  Box<Imath_2_5::Vec3<double>_> *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  Box<Imath_2_5::Vec3<double>_> *in_stack_fffffffffffffea0;
  Box<Imath_2_5::Vec3<double>_> *in_stack_fffffffffffffeb8;
  Box<Imath_2_5::Vec3<double>_> *in_stack_fffffffffffffec0;
  Vec3<double> local_130;
  Vec3<double> local_118 [3];
  uint local_cc;
  Vec3<double> local_c8;
  Vec3<double> local_b0;
  Vec3<double> local_98;
  Vec3<double> local_80 [5];
  char *local_8;
  
  local_8 = in_RDI;
  poVar5 = std::operator<<((ostream *)&std::cout,"    isInfinite() for type ");
  poVar5 = std::operator<<(poVar5,local_8);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Box<Imath_2_5::Vec3<double>_>::Box(in_stack_fffffffffffffe90);
  Imath_2_5::Box<Imath_2_5::Vec3<double>_>::makeInfinite(in_stack_fffffffffffffec0);
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec3<double>_>::isInfinite(in_stack_fffffffffffffeb8);
  if (!bVar2) {
    __assert_fail("b.isInfinite()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,799,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_2_5::Vec3<double>]"
                 );
  }
  Imath_2_5::Vec3<double>::Vec3(local_80,-1.0);
  Imath_2_5::Vec3<double>::Vec3(&local_98,1.0);
  Imath_2_5::Box<Imath_2_5::Vec3<double>_>::Box
            (in_stack_fffffffffffffea0,
             (Vec3<double> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             &in_stack_fffffffffffffe90->min);
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec3<double>_>::isInfinite(in_stack_fffffffffffffeb8);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b0.isInfinite()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x32a,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_2_5::Vec3<double>]"
                 );
  }
  Imath_2_5::Vec3<double>::Vec3(&local_b0);
  Imath_2_5::Vec3<double>::Vec3(&local_c8);
  local_cc = 0;
  while( true ) {
    uVar4 = local_cc;
    uVar3 = Imath_2_5::Vec3<double>::dimensions();
    if (uVar3 <= uVar4) break;
    cVar1 = (char)local_cc;
    pdVar6 = Imath_2_5::Vec3<double>::operator[](&local_b0,local_cc);
    *pdVar6 = -(double)(1 << (cVar1 + 1U & 0x1f));
    uVar4 = Imath_2_5::Vec3<double>::dimensions();
    in_stack_fffffffffffffe90 =
         (Box<Imath_2_5::Vec3<double>_> *)(double)(1 << ((char)uVar4 - (char)local_cc & 0x1fU));
    pdVar6 = Imath_2_5::Vec3<double>::operator[](&local_c8,local_cc);
    *pdVar6 = (double)in_stack_fffffffffffffe90;
    local_cc = local_cc + 1;
  }
  Imath_2_5::Box<Imath_2_5::Vec3<double>_>::Box
            (in_stack_fffffffffffffea0,(Vec3<double> *)CONCAT44(uVar4,in_stack_fffffffffffffe98),
             &in_stack_fffffffffffffe90->min);
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec3<double>_>::isInfinite(in_stack_fffffffffffffeb8);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b1.isInfinite()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x334,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_2_5::Vec3<double>]"
                 );
  }
  Imath_2_5::Vec3<double>::Vec3(local_118,0.0);
  Imath_2_5::Vec3<double>::Vec3(&local_130,local_118);
  uVar3 = Imath_2_5::Vec3<double>::dimensions();
  pdVar6 = Imath_2_5::Vec3<double>::operator[](&local_130,uVar3 - 1);
  *pdVar6 = 2.0;
  Imath_2_5::Box<Imath_2_5::Vec3<double>_>::Box
            (in_stack_fffffffffffffea0,(Vec3<double> *)CONCAT44(uVar4,in_stack_fffffffffffffe98),
             &in_stack_fffffffffffffe90->min);
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec3<double>_>::isInfinite(in_stack_fffffffffffffeb8);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.isInfinite()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x345,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_2_5::Vec3<double>]"
                 );
  }
  return;
}

Assistant:

void
testIsInfinite(const char *type)
{
    cout << "    isInfinite() for type " << type << endl;

    //
    // Infinite box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        b.makeInfinite();
        assert(b.isInfinite());
    }

    //
    // Non-empty, has-volume box.
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0(T(-1), T(1));
        assert(!b0.isInfinite());

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions(); i++)
        {
            p0[i] = -typename T::BaseType(1 << (i + 1));
            p1[i] =  typename T::BaseType(1 << (T::dimensions() - i));
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1(p0, p1);
        assert(!b1.isInfinite());
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min(0);
        T max = min;
        max[T::dimensions() - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b(min, max);

        assert(!b.isInfinite());
    }
}